

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86.cpp
# Opt level: O1

int __thiscall ncnn::Swish_x86::forward_inplace(Swish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  undefined1 (*pauVar8) [16];
  long lVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar7 = 0;
    do {
      pauVar8 = (undefined1 (*) [16])
                (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      if ((int)uVar6 < 4) {
        uVar5 = 0;
      }
      else {
        iVar4 = 3;
        do {
          auVar10 = *pauVar8;
          auVar19._0_8_ = auVar10._0_8_ ^ 0x8000000080000000;
          auVar19._8_4_ = auVar10._8_4_ ^ 0x80000000;
          auVar19._12_4_ = auVar10._12_4_ ^ 0x80000000;
          auVar2._8_4_ = 0x42b0c0a5;
          auVar2._0_8_ = 0x42b0c0a542b0c0a5;
          auVar2._12_4_ = 0x42b0c0a5;
          auVar20 = minps(auVar19,auVar2);
          auVar3._8_4_ = 0xc2b0c0a5;
          auVar3._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar3._12_4_ = 0xc2b0c0a5;
          auVar20 = maxps(auVar20,auVar3);
          fVar15 = auVar20._0_4_ * 1.442695 + 0.5;
          fVar16 = auVar20._4_4_ * 1.442695 + 0.5;
          fVar17 = auVar20._8_4_ * 1.442695 + 0.5;
          fVar18 = auVar20._12_4_ * 1.442695 + 0.5;
          fVar11 = (float)(int)fVar15;
          fVar12 = (float)(int)fVar16;
          fVar13 = (float)(int)fVar17;
          fVar14 = (float)(int)fVar18;
          fVar11 = fVar11 - (float)(-(uint)(fVar15 < fVar11) & 0x3f800000);
          fVar12 = fVar12 - (float)(-(uint)(fVar16 < fVar12) & 0x3f800000);
          fVar13 = fVar13 - (float)(-(uint)(fVar17 < fVar13) & 0x3f800000);
          fVar14 = fVar14 - (float)(-(uint)(fVar18 < fVar14) & 0x3f800000);
          fVar15 = fVar11 * -0.6931472 + auVar20._0_4_;
          fVar16 = fVar12 * -0.6931472 + auVar20._4_4_;
          fVar17 = fVar13 * -0.6931472 + auVar20._8_4_;
          fVar18 = fVar14 * -0.6931472 + auVar20._12_4_;
          auVar20._4_4_ =
               (float)((int)fVar12 * 0x800000 + 0x3f800000) *
               (fVar16 + 1.0 +
               (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
                 0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5) * fVar16 * fVar16) + 1.0;
          auVar20._0_4_ =
               (float)((int)fVar11 * 0x800000 + 0x3f800000) *
               (fVar15 + 1.0 +
               (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
                 0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5) * fVar15 * fVar15) + 1.0;
          auVar20._8_4_ =
               (float)((int)fVar13 * 0x800000 + 0x3f800000) *
               (fVar17 + 1.0 +
               (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
                 0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5) * fVar17 * fVar17) + 1.0;
          auVar20._12_4_ =
               (float)((int)fVar14 * 0x800000 + 0x3f800000) *
               (fVar18 + 1.0 +
               (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
                 0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5) * fVar18 * fVar18) + 1.0;
          auVar10 = divps(auVar10,auVar20);
          *pauVar8 = auVar10;
          pauVar8 = pauVar8 + 1;
          iVar4 = iVar4 + 4;
          uVar5 = uVar6 & 0xfffffffc;
        } while (iVar4 < (int)uVar6);
      }
      if (uVar6 - uVar5 != 0 && (int)uVar5 <= (int)uVar6) {
        lVar9 = 0;
        do {
          fVar11 = *(float *)(*pauVar8 + lVar9 * 4);
          fVar12 = expf(-fVar11);
          *(float *)(*pauVar8 + lVar9 * 4) = fVar11 / (fVar12 + 1.0);
          lVar9 = lVar9 + 1;
        } while (uVar6 - uVar5 != (int)lVar9);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return 0;
}

Assistant:

int Swish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_p, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_p, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_p, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + expf(-*ptr));
            ptr++;
        }
    }

    return 0;
}